

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfZip.cpp
# Opt level: O2

int __thiscall Imf_3_4::Zip::uncompress(Zip *this,char *compressed,int compressedSize,char *raw)

{
  int iVar1;
  InputExc *this_00;
  size_t outSize;
  
  iVar1 = exr_uncompress_buffer
                    (0,compressed,(long)compressedSize,this->_tmpBuffer,this->_maxRawSize);
  if (iVar1 != 0) {
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::InputExc::InputExc(this_00,"Data decompression failed.");
    __cxa_throw(this_00,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
  }
  return 0;
}

Assistant:

int
Zip::uncompress (const char* compressed, int compressedSize, char* raw)
{
    size_t outSize = 0;
    if (EXR_ERR_SUCCESS != exr_uncompress_buffer (
                               nullptr,
                               compressed,
                               (size_t) compressedSize,
                               _tmpBuffer,
                               _maxRawSize,
                               &outSize))
    {
        throw IEX_NAMESPACE::InputExc ("Data decompression failed.");
    }

    if (outSize == 0) { return static_cast<int> (outSize); }

    //
    // Predictor.
    //
    reconstruct (_tmpBuffer, outSize);

    //
    // Reorder the pixel data.
    //
    interleave (_tmpBuffer, outSize, raw);

    return outSize;
}